

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::MergePartialFromCodedStream
          (MessageLite *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 tag;
  DescriptorPool *pDVar2;
  Data *pDVar3;
  MessageFactory *pMVar4;
  CodedInputStream *in_RSI;
  long *in_RDI;
  ParseContext ctx;
  char *ptr;
  ZeroCopyCodedInputStream zcis;
  CodedInputStream *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffebb;
  int in_stack_fffffffffffffebc;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  char *in_stack_ffffffffffffff18;
  EpsCopyInputStream *in_stack_ffffffffffffff20;
  ParseContext local_a0;
  char *local_30;
  ZeroCopyCodedInputStream local_28;
  CodedInputStream *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  ZeroCopyCodedInputStream::ZeroCopyCodedInputStream
            ((ZeroCopyCodedInputStream *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
            );
  io::CodedInputStream::RecursionBudget(local_18);
  ZeroCopyCodedInputStream::aliasing_enabled(&local_28);
  internal::ParseContext::ParseContext<google::protobuf::ZeroCopyCodedInputStream*>
            ((ParseContext *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc,(bool)in_stack_fffffffffffffebb,
             (char **)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (ZeroCopyCodedInputStream **)in_stack_fffffffffffffea8);
  internal::ParseContext::TrackCorrectEnding(&local_a0);
  pDVar2 = io::CodedInputStream::GetExtensionPool(local_18);
  pDVar3 = internal::ParseContext::data(&local_a0);
  pDVar3->pool = pDVar2;
  pMVar4 = io::CodedInputStream::GetExtensionFactory(local_18);
  pDVar3 = internal::ParseContext::data(&local_a0);
  pDVar3->factory = pMVar4;
  local_30 = (char *)(**(code **)(*in_RDI + 0x68))(in_RDI,local_30,&local_a0);
  if (local_30 == (char *)0x0) {
    local_1 = 0;
  }
  else {
    internal::EpsCopyInputStream::BackUp(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    bVar1 = internal::EpsCopyInputStream::EndedAtEndOfStream(&local_a0.super_EpsCopyInputStream);
    if (bVar1) {
      io::CodedInputStream::SetConsumed(local_18);
      local_1 = 1;
    }
    else {
      bVar1 = internal::EpsCopyInputStream::IsExceedingLimit
                        (&local_a0.super_EpsCopyInputStream,local_30);
      if (bVar1) {
        local_1 = 0;
      }
      else {
        tag = internal::EpsCopyInputStream::LastTag(&local_a0.super_EpsCopyInputStream);
        io::CodedInputStream::SetLastTag(local_18,tag);
        local_1 = 1;
      }
    }
  }
  ZeroCopyCodedInputStream::~ZeroCopyCodedInputStream((ZeroCopyCodedInputStream *)0x3efc72);
  return (bool)(local_1 & 1);
}

Assistant:

bool MessageLite::MergePartialFromCodedStream(io::CodedInputStream* input) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
    return true;
  }
  input->SetConsumed();
  return true;
}